

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall flatbuffers::Parser::ParseComma(Parser *this)

{
  bool bVar1;
  long in_RSI;
  Parser *this_local;
  CheckedError *ce;
  
  if ((*(byte *)(in_RSI + 0x548) & 1) == 0) {
    Expect(this,(int)in_RSI);
    bVar1 = CheckedError::Check((CheckedError *)this);
    if (bVar1) goto LAB_00114c09;
    CheckedError::~CheckedError((CheckedError *)this);
  }
  anon_unknown_0::NoError();
LAB_00114c09:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseComma() {
  if (!opts.protobuf_ascii_alike) EXPECT(',');
  return NoError();
}